

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Cec_ManRefinedClassPrintStats(Gia_Man_t *p,Vec_Str_t *vStatus,int iIter,abctime Time)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  abctime time;
  long lVar6;
  Gia_Man_t *pGVar7;
  uint uVar8;
  uint uVar9;
  int local_44;
  uint local_40;
  
  iVar5 = p->nObjs;
  local_40 = 0;
  uVar8 = 0;
  local_44 = 0;
  for (lVar6 = 1; lVar6 < iVar5; lVar6 = lVar6 + 1) {
    uVar2 = (uint)p->pReprs[lVar6] & 0xfffffff;
    if (uVar2 == 0) {
      local_40 = local_40 + 1;
    }
    else if ((uVar2 == 0xfffffff) && (p->pNexts[lVar6] < 1)) {
      local_44 = local_44 + 1;
    }
    else {
      iVar3 = Gia_ObjIsHead(p,(int)lVar6);
      uVar8 = uVar8 + iVar3;
    }
  }
  iVar5 = p->vCos->nSize;
  iVar3 = p->vCis->nSize;
  pGVar7 = p;
  iVar4 = Gia_ManAndNum(p);
  if (iIter == -1) {
    Abc_Print((int)pGVar7,"BMC : ");
  }
  else {
    Abc_Print((int)pGVar7,"%3d : ");
  }
  uVar9 = 0;
  Abc_Print((int)pGVar7,"c =%8d  cl =%7d  lit =%8d  ",(ulong)local_40,(ulong)uVar8,
            (ulong)(iVar4 + (iVar5 - (local_44 + uVar8)) + iVar3));
  iVar5 = (int)pGVar7;
  uVar8 = 0;
  uVar2 = 0;
  if (vStatus != (Vec_Str_t *)0x0) {
    uVar9 = 0;
    uVar8 = 0;
    uVar2 = 0;
    for (iVar3 = 0; iVar5 = (int)pGVar7, iVar3 < vStatus->nSize; iVar3 = iVar3 + 1) {
      pGVar7 = (Gia_Man_t *)vStatus;
      cVar1 = Vec_StrEntry(vStatus,iVar3);
      if (cVar1 == '\0') {
        uVar8 = uVar8 + 1;
      }
      else if (cVar1 == -1) {
        uVar2 = uVar2 + 1;
      }
      else if (cVar1 == '\x01') {
        uVar9 = uVar9 + 1;
      }
    }
  }
  iVar3 = 0x82db66;
  Abc_Print(iVar5,"p =%6d  d =%6d  f =%6d  ",(ulong)uVar9,(ulong)uVar8,(ulong)uVar2);
  pObj = Gia_ManPo(p,iVar3);
  pGVar7 = p;
  iVar5 = Gia_ObjFaninId0p(p,pObj);
  Abc_Print((int)pGVar7,"%c  ",(ulong)((uint)(((uint)p->pReprs[iVar5] & 0xfffffff) != 0) * 2 + 0x2b)
           );
  Abc_PrintTime(0x8ad9f9,(char *)Time,time);
  return;
}

Assistant:

void Cec_ManRefinedClassPrintStats( Gia_Man_t * p, Vec_Str_t * vStatus, int iIter, abctime Time )
{ 
    int nLits, CounterX = 0, Counter0 = 0, Counter = 0;
    int i, Entry, nProve = 0, nDispr = 0, nFail = 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsNone(p, i) )
            CounterX++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsHead(p, i) )
            Counter++;
    }
    CounterX -= Gia_ManCoNum(p);
    nLits = Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
    if ( iIter == -1 )
        Abc_Print( 1, "BMC : " );
    else
        Abc_Print( 1, "%3d : ", iIter );
    Abc_Print( 1, "c =%8d  cl =%7d  lit =%8d  ", Counter0, Counter, nLits );
    if ( vStatus )
    Vec_StrForEachEntry( vStatus, Entry, i )
    {
        if ( Entry == 1 )
            nProve++;
        else if ( Entry == 0 )
            nDispr++;
        else if ( Entry == -1 )
            nFail++;
    }
    Abc_Print( 1, "p =%6d  d =%6d  f =%6d  ", nProve, nDispr, nFail );
    Abc_Print( 1, "%c  ", Gia_ObjIsConst( p, Gia_ObjFaninId0p(p, Gia_ManPo(p, 0)) ) ? '+' : '-' );
    Abc_PrintTime( 1, "T", Time );
}